

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O0

bool vkt::ssbo::anon_unknown_15::compareBufferVarData
               (TestLog *log,BufferVarLayoutEntry *refEntry,BlockDataPtr *refBlockPtr,
               BufferVarLayoutEntry *resEntry,BlockDataPtr *resBlockPtr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint8 *ref;
  void *res;
  MessageBuilder *pMVar4;
  bool local_bf5;
  int local_bf4;
  int local_be4;
  int local_bd8;
  int local_bd4;
  int local_bd0;
  int local_bcc;
  MessageBuilder local_bc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  MessageBuilder local_a08;
  ostringstream local_888 [8];
  ostringstream got_1;
  ostringstream local_710 [8];
  ostringstream expected_1;
  undefined1 local_590 [7];
  bool isOk_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  MessageBuilder local_550;
  ostringstream local_3c0 [8];
  ostringstream got;
  ostringstream local_248 [8];
  ostringstream expected;
  deUint8 *refCompPtr;
  deUint8 *resCompPtr;
  int local_b8;
  int rowNdx;
  int colNdx;
  bool isOk;
  int numCols;
  int numRows;
  deUint8 *refElemPtr;
  deUint8 *resElemPtr;
  long lStack_90;
  int elementNdx;
  deUint8 *refTopPtr;
  deUint8 *resTopPtr;
  int local_78;
  int topElemNdx;
  int refTopLevelStride;
  int refTopLevelSize;
  int refArrayStride;
  int refArraySize;
  int resTopLevelStride;
  int resTopLevelSize;
  int resArrayStride;
  int resArraySize;
  int numFailed;
  int maxPrints;
  int compSize;
  DataType DStack_44;
  bool isMatrix;
  int scalarSize;
  DataType scalarType;
  deUint8 *refBasePtr;
  deUint8 *resBasePtr;
  BlockDataPtr *resBlockPtr_local;
  BufferVarLayoutEntry *resEntry_local;
  BlockDataPtr *refBlockPtr_local;
  BufferVarLayoutEntry *refEntry_local;
  TestLog *log_local;
  
  refBasePtr = (deUint8 *)((long)resBlockPtr->ptr + (long)resEntry->offset);
  _scalarSize = (long)refBlockPtr->ptr + (long)refEntry->offset;
  resBasePtr = (deUint8 *)resBlockPtr;
  resBlockPtr_local = (BlockDataPtr *)resEntry;
  resEntry_local = (BufferVarLayoutEntry *)refBlockPtr;
  refBlockPtr_local = (BlockDataPtr *)refEntry;
  refEntry_local = (BufferVarLayoutEntry *)log;
  DStack_44 = glu::getDataTypeScalarType(refEntry->type);
  compSize = glu::getDataTypeScalarSize(*(DataType *)&resBlockPtr_local[2].ptr);
  maxPrints._3_1_ = glu::isDataTypeMatrix(*(DataType *)&resBlockPtr_local[2].ptr);
  numFailed = 4;
  resArraySize = 3;
  resArrayStride = 0;
  if (resBlockPtr_local[2].lastUnsizedArraySize == 0) {
    local_bcc = *(int *)(resBasePtr + 0xc);
  }
  else {
    local_bcc = resBlockPtr_local[2].lastUnsizedArraySize;
  }
  resTopLevelSize = local_bcc;
  resTopLevelStride = *(int *)&resBlockPtr_local[3].ptr;
  if (resBlockPtr_local[3].size == 0) {
    local_bd0 = *(int *)(resBasePtr + 0xc);
  }
  else {
    local_bd0 = resBlockPtr_local[3].size;
  }
  refArraySize = local_bd0;
  refArrayStride = resBlockPtr_local[3].lastUnsizedArraySize;
  if (refBlockPtr_local[2].lastUnsizedArraySize == 0) {
    local_bd4 = *(int *)((long)&(resEntry_local->name)._M_string_length + 4);
  }
  else {
    local_bd4 = refBlockPtr_local[2].lastUnsizedArraySize;
  }
  refTopLevelSize = local_bd4;
  refTopLevelStride = *(int *)&refBlockPtr_local[3].ptr;
  if (refBlockPtr_local[3].size == 0) {
    local_bd8 = *(int *)((long)&(resEntry_local->name)._M_string_length + 4);
  }
  else {
    local_bd8 = refBlockPtr_local[3].size;
  }
  topElemNdx = local_bd8;
  local_78 = refBlockPtr_local[3].lastUnsizedArraySize;
  for (resTopPtr._4_4_ = 0; resTopPtr._4_4_ < refArraySize; resTopPtr._4_4_ = resTopPtr._4_4_ + 1) {
    refTopPtr = refBasePtr + resTopPtr._4_4_ * refArrayStride;
    lStack_90 = _scalarSize + resTopPtr._4_4_ * local_78;
    for (resElemPtr._4_4_ = 0; resElemPtr._4_4_ < resTopLevelSize;
        resElemPtr._4_4_ = resElemPtr._4_4_ + 1) {
      ref = refTopPtr + resElemPtr._4_4_ * resTopLevelStride;
      res = (void *)(lStack_90 + resElemPtr._4_4_ * refTopLevelStride);
      if ((maxPrints._3_1_ & 1) == 0) {
        bVar1 = compareComponents(DStack_44,ref,res,compSize);
        if ((!bVar1) && (resArrayStride = resArrayStride + 1, resArrayStride < 3)) {
          std::__cxx11::ostringstream::ostringstream(local_710);
          std::__cxx11::ostringstream::ostringstream(local_888);
          generateImmScalarVectorSrc
                    ((ostream *)local_710,*(DataType *)&refBlockPtr_local[2].ptr,res);
          generateImmScalarVectorSrc
                    ((ostream *)local_888,*(DataType *)&resBlockPtr_local[2].ptr,ref);
          tcu::TestLog::operator<<
                    (&local_a08,(TestLog *)refEntry_local,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<(&local_a08,(char (*) [20])"ERROR: mismatch in ");
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)refBlockPtr_local);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])", top-level ndx ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&resTopPtr + 4));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])", bottom-level ndx ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&resElemPtr + 4));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x1315f3d);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])"  expected ");
          std::__cxx11::ostringstream::str();
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_a28);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x1387264);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])"  got ");
          std::__cxx11::ostringstream::str();
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_a48);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_a48);
          std::__cxx11::string::~string((string *)&local_a28);
          tcu::MessageBuilder::~MessageBuilder(&local_a08);
          std::__cxx11::ostringstream::~ostringstream(local_888);
          std::__cxx11::ostringstream::~ostringstream(local_710);
        }
      }
      else {
        iVar2 = glu::getDataTypeMatrixNumRows(*(DataType *)&resBlockPtr_local[2].ptr);
        iVar3 = glu::getDataTypeMatrixNumColumns(*(DataType *)&resBlockPtr_local[2].ptr);
        rowNdx._3_1_ = true;
        for (local_b8 = 0; local_b8 < iVar3; local_b8 = local_b8 + 1) {
          for (resCompPtr._4_4_ = 0; resCompPtr._4_4_ < iVar2;
              resCompPtr._4_4_ = resCompPtr._4_4_ + 1) {
            if (((ulong)resBlockPtr_local[4].ptr & 1) == 0) {
              local_be4 = local_b8 * *(int *)((long)&resBlockPtr_local[3].ptr + 4) +
                          resCompPtr._4_4_ * 4;
            }
            else {
              local_be4 = resCompPtr._4_4_ * *(int *)((long)&resBlockPtr_local[3].ptr + 4) +
                          local_b8 * 4;
            }
            if (((ulong)refBlockPtr_local[4].ptr & 1) == 0) {
              local_bf4 = local_b8 * *(int *)((long)&refBlockPtr_local[3].ptr + 4) +
                          resCompPtr._4_4_ * 4;
            }
            else {
              local_bf4 = resCompPtr._4_4_ * *(int *)((long)&refBlockPtr_local[3].ptr + 4) +
                          local_b8 * 4;
            }
            local_bf5 = false;
            if (rowNdx._3_1_ != false) {
              local_bf5 = compareComponents(DStack_44,ref + local_be4,
                                            (void *)((long)res + (long)local_bf4),1);
            }
            rowNdx._3_1_ = local_bf5;
          }
        }
        if ((rowNdx._3_1_ == false) && (resArrayStride = resArrayStride + 1, resArrayStride < 3)) {
          std::__cxx11::ostringstream::ostringstream(local_248);
          std::__cxx11::ostringstream::ostringstream(local_3c0);
          generateImmMatrixSrc
                    ((ostream *)local_248,*(DataType *)&refBlockPtr_local[2].ptr,
                     *(int *)((long)&refBlockPtr_local[3].ptr + 4),
                     (bool)(*(byte *)&refBlockPtr_local[4].ptr & 1),res);
          generateImmMatrixSrc
                    ((ostream *)local_3c0,*(DataType *)&resBlockPtr_local[2].ptr,
                     *(int *)((long)&resBlockPtr_local[3].ptr + 4),
                     (bool)(*(byte *)&resBlockPtr_local[4].ptr & 1),ref);
          tcu::TestLog::operator<<
                    (&local_550,(TestLog *)refEntry_local,
                     (BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<(&local_550,(char (*) [20])"ERROR: mismatch in ");
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)refBlockPtr_local);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [17])", top-level ndx ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&resTopPtr + 4));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [20])", bottom-level ndx ");
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(int *)((long)&resElemPtr + 4));
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x1315f3d);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])"  expected ");
          std::__cxx11::ostringstream::str();
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_570);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x1387264);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])"  got ");
          std::__cxx11::ostringstream::str();
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_590);
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)local_590);
          std::__cxx11::string::~string((string *)&local_570);
          tcu::MessageBuilder::~MessageBuilder(&local_550);
          std::__cxx11::ostringstream::~ostringstream(local_3c0);
          std::__cxx11::ostringstream::~ostringstream(local_248);
        }
      }
    }
  }
  if (2 < resArrayStride) {
    tcu::TestLog::operator<<
              (&local_bc8,(TestLog *)refEntry_local,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_bc8,(char (*) [6])"... (");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&resArrayStride);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])" failures for ");
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               refBlockPtr_local);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])" in total)");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_bc8);
  }
  return resArrayStride == 0;
}

Assistant:

bool compareBufferVarData (tcu::TestLog& log, const BufferVarLayoutEntry& refEntry, const BlockDataPtr& refBlockPtr, const BufferVarLayoutEntry& resEntry, const BlockDataPtr& resBlockPtr)
{
	DE_ASSERT(resEntry.arraySize <= refEntry.arraySize);
	DE_ASSERT(resEntry.topLevelArraySize <= refEntry.topLevelArraySize);
	DE_ASSERT(resBlockPtr.lastUnsizedArraySize <= refBlockPtr.lastUnsizedArraySize);
	DE_ASSERT(resEntry.type == refEntry.type);

	deUint8* const			resBasePtr			= (deUint8*)resBlockPtr.ptr + resEntry.offset;
	const deUint8* const	refBasePtr			= (const deUint8*)refBlockPtr.ptr + refEntry.offset;
	const glu::DataType		scalarType			= glu::getDataTypeScalarType(refEntry.type);
	const int				scalarSize			= glu::getDataTypeScalarSize(resEntry.type);
	const bool				isMatrix			= glu::isDataTypeMatrix(resEntry.type);
	const int				compSize			= sizeof(deUint32);
	const int				maxPrints			= 3;
	int						numFailed			= 0;

	const int				resArraySize		= resEntry.arraySize == 0 ? resBlockPtr.lastUnsizedArraySize : resEntry.arraySize;
	const int				resArrayStride		= resEntry.arrayStride;
	const int				resTopLevelSize		= resEntry.topLevelArraySize == 0 ? resBlockPtr.lastUnsizedArraySize : resEntry.topLevelArraySize;
	const int				resTopLevelStride	= resEntry.topLevelArrayStride;
	const int				refArraySize		= refEntry.arraySize == 0 ? refBlockPtr.lastUnsizedArraySize : refEntry.arraySize;
	const int				refArrayStride		= refEntry.arrayStride;
	const int				refTopLevelSize		= refEntry.topLevelArraySize == 0 ? refBlockPtr.lastUnsizedArraySize : refEntry.topLevelArraySize;
	const int				refTopLevelStride	= refEntry.topLevelArrayStride;

	DE_ASSERT(resArraySize <= refArraySize && resTopLevelSize <= refTopLevelSize);
	DE_UNREF(refArraySize && refTopLevelSize);

	for (int topElemNdx = 0; topElemNdx < resTopLevelSize; topElemNdx++)
	{
		deUint8* const			resTopPtr	= resBasePtr + topElemNdx*resTopLevelStride;
		const deUint8* const	refTopPtr	= refBasePtr + topElemNdx*refTopLevelStride;

		for (int elementNdx = 0; elementNdx < resArraySize; elementNdx++)
		{
			deUint8* const			resElemPtr	= resTopPtr + elementNdx*resArrayStride;
			const deUint8* const	refElemPtr	= refTopPtr + elementNdx*refArrayStride;

			if (isMatrix)
			{
				const int	numRows	= glu::getDataTypeMatrixNumRows(resEntry.type);
				const int	numCols	= glu::getDataTypeMatrixNumColumns(resEntry.type);
				bool		isOk	= true;

				for (int colNdx = 0; colNdx < numCols; colNdx++)
				{
					for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
					{
						deUint8*		resCompPtr	= resElemPtr + (resEntry.isRowMajor ? rowNdx*resEntry.matrixStride + colNdx*compSize
																						: colNdx*resEntry.matrixStride + rowNdx*compSize);
						const deUint8*	refCompPtr	= refElemPtr + (refEntry.isRowMajor ? rowNdx*refEntry.matrixStride + colNdx*compSize
																						: colNdx*refEntry.matrixStride + rowNdx*compSize);

						DE_ASSERT((deIntptr)(refCompPtr + compSize) - (deIntptr)refBlockPtr.ptr <= (deIntptr)refBlockPtr.size);
						DE_ASSERT((deIntptr)(resCompPtr + compSize) - (deIntptr)resBlockPtr.ptr <= (deIntptr)resBlockPtr.size);

						isOk = isOk && compareComponents(scalarType, resCompPtr, refCompPtr, 1);
					}
				}

				if (!isOk)
				{
					numFailed += 1;
					if (numFailed < maxPrints)
					{
						std::ostringstream expected, got;
						generateImmMatrixSrc(expected, refEntry.type, refEntry.matrixStride, refEntry.isRowMajor, refElemPtr);
						generateImmMatrixSrc(got, resEntry.type, resEntry.matrixStride, resEntry.isRowMajor, resElemPtr);
						log << TestLog::Message << "ERROR: mismatch in " << refEntry.name << ", top-level ndx " << topElemNdx << ", bottom-level ndx " << elementNdx << ":\n"
												<< "  expected " << expected.str() << "\n"
												<< "  got " << got.str()
							<< TestLog::EndMessage;
					}
				}
			}
			else
			{
				DE_ASSERT((deIntptr)(refElemPtr + scalarSize*compSize) - (deIntptr)refBlockPtr.ptr <= (deIntptr)refBlockPtr.size);
				DE_ASSERT((deIntptr)(resElemPtr + scalarSize*compSize) - (deIntptr)resBlockPtr.ptr <= (deIntptr)resBlockPtr.size);

				const bool isOk = compareComponents(scalarType, resElemPtr, refElemPtr, scalarSize);

				if (!isOk)
				{
					numFailed += 1;
					if (numFailed < maxPrints)
					{
						std::ostringstream expected, got;
						generateImmScalarVectorSrc(expected, refEntry.type, refElemPtr);
						generateImmScalarVectorSrc(got, resEntry.type, resElemPtr);
						log << TestLog::Message << "ERROR: mismatch in " << refEntry.name << ", top-level ndx " << topElemNdx << ", bottom-level ndx " << elementNdx << ":\n"
												<< "  expected " << expected.str() << "\n"
												<< "  got " << got.str()
							<< TestLog::EndMessage;
					}
				}
			}
		}
	}

	if (numFailed >= maxPrints)
		log << TestLog::Message << "... (" << numFailed << " failures for " << refEntry.name << " in total)" << TestLog::EndMessage;

	return numFailed == 0;
}